

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::initialiseSimplexLpRandomVectors(HEkk *this)

{
  int iVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar6;
  HighsInt i_2;
  vector<double,_std::allocator<double>_> *numTotRandomValue;
  HighsInt i_1;
  vector<int,_std::allocator<int>_> *numTotPermutation;
  HighsInt i;
  vector<int,_std::allocator<int>_> *numColPermutation;
  HighsRandom *random;
  HighsInt num_tot;
  HighsInt num_col;
  undefined8 in_stack_ffffffffffffff90;
  HighsInt N;
  vector<double,_std::allocator<double>_> *pvVar7;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_44;
  int local_34;
  int local_24;
  
  iVar1 = *(int *)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish +
          *(int *)((long)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4);
  if (iVar3 != 0) {
    pvVar7 = in_RDI + 0x1c1;
    if (iVar1 != 0) {
      pvVar2 = in_RDI + 0x19c;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_RDI,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      for (local_24 = 0; N = (HighsInt)((ulong)in_stack_ffffffffffffff90 >> 0x20), local_24 < iVar1;
          local_24 = local_24 + 1) {
        in_stack_ffffffffffffffac = local_24;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)local_24);
        *pvVar4 = in_stack_ffffffffffffffac;
      }
      in_stack_ffffffffffffffa0 = pvVar7;
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x76df89);
      HighsRandom::shuffle<int>
                ((HighsRandom *)in_stack_ffffffffffffffa0,
                 (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),N);
    }
    pvVar2 = in_RDI + 0x19b;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
      in_stack_ffffffffffffff9c = local_34;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_34);
      *pvVar4 = in_stack_ffffffffffffff9c;
    }
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x76e00f);
    HighsRandom::shuffle<int>
              ((HighsRandom *)in_stack_ffffffffffffffa0,
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (HighsInt)((ulong)pvVar7 >> 0x20));
    std::vector<double,_std::allocator<double>_>::resize
              (in_RDI,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      dVar6 = HighsRandom::fraction((HighsRandom *)in_stack_ffffffffffffffa0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x19a].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)local_44);
      *pvVar5 = dVar6;
    }
  }
  return;
}

Assistant:

void HEkk::initialiseSimplexLpRandomVectors() {
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  if (!num_tot) return;
  // Instantiate and (re-)initialise the random number generator
  //  HighsRandom random;
  HighsRandom& random = random_;
  //  random.initialise();

  if (num_col) {
    // Generate a random permutation of the column indices
    vector<HighsInt>& numColPermutation = info_.numColPermutation_;
    numColPermutation.resize(num_col);
    for (HighsInt i = 0; i < num_col; i++) numColPermutation[i] = i;
    random.shuffle(numColPermutation.data(), num_col);
  }

  // Re-initialise the random number generator and generate the
  // random vectors in the same order as hsol to maintain repeatable
  // performance
  // random.initialise();

  // Generate a random permutation of all the indices
  vector<HighsInt>& numTotPermutation = info_.numTotPermutation_;
  numTotPermutation.resize(num_tot);
  for (HighsInt i = 0; i < num_tot; i++) numTotPermutation[i] = i;
  random.shuffle(numTotPermutation.data(), num_tot);

  // Generate a vector of random reals
  info_.numTotRandomValue_.resize(num_tot);
  vector<double>& numTotRandomValue = info_.numTotRandomValue_;
  for (HighsInt i = 0; i < num_tot; i++) {
    numTotRandomValue[i] = random.fraction();
  }
}